

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

string * __thiscall
testing::FormatCountableNoun_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,int count,char *singular_form,
          char *plural_form)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  int local_64;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  local_64 = (int)this;
  internal::StreamableToString<int>(&local_40,&local_64);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  psVar3 = (string *)&local_40.field_2;
  if ((string *)local_40._M_dataplus._M_p != psVar3) {
    operator_delete(local_40._M_dataplus._M_p);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string FormatCountableNoun(int count,
                                       const char * singular_form,
                                       const char * plural_form) {
  return internal::StreamableToString(count) + " " +
      (count == 1 ? singular_form : plural_form);
}